

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int dtdInit(DTD *p,XML_Parser parser)

{
  XML_Memory_Handling_Suite *ms_00;
  XML_Memory_Handling_Suite *ms;
  XML_Parser parser_local;
  DTD *p_local;
  
  ms_00 = (XML_Memory_Handling_Suite *)((long)parser + 0x18);
  poolInit(&p->pool,ms_00);
  hashTableInit(&p->generalEntities,ms_00);
  hashTableInit(&p->elementTypes,ms_00);
  hashTableInit(&p->attributeIds,ms_00);
  hashTableInit(&p->prefixes,ms_00);
  p->complete = 1;
  p->standalone = 0;
  hashTableInit(&p->paramEntities,ms_00);
  (p->defaultPrefix).name = (XML_Char *)0x0;
  (p->defaultPrefix).binding = (BINDING *)0x0;
  p->in_eldecl = 0;
  p->scaffIndex = (int *)0x0;
  p->scaffLevel = 0;
  p->scaffold = (CONTENT_SCAFFOLD *)0x0;
  p->contentStringLen = 0;
  p->scaffSize = 0;
  p->scaffCount = 0;
  return 1;
}

Assistant:

static int dtdInit(DTD *p, XML_Parser parser)
{
  XML_Memory_Handling_Suite *ms = &((Parser *) parser)->m_mem; 
  poolInit(&(p->pool), ms);
  hashTableInit(&(p->generalEntities), ms);
  hashTableInit(&(p->elementTypes), ms);
  hashTableInit(&(p->attributeIds), ms);
  hashTableInit(&(p->prefixes), ms);
  p->complete = 1;
  p->standalone = 0;
#ifdef XML_DTD
  hashTableInit(&(p->paramEntities), ms);
#endif /* XML_DTD */
  p->defaultPrefix.name = 0;
  p->defaultPrefix.binding = 0;

  p->in_eldecl = 0;
  p->scaffIndex = 0;
  p->scaffLevel = 0;
  p->scaffold = 0;
  p->contentStringLen = 0;
  p->scaffSize = 0;
  p->scaffCount = 0;

  return 1;
}